

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_mthd_misc.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdNop::adjust_orig_mthd(MthdNop *this)

{
  mt19937 *this_00;
  uint32_t *puVar1;
  uint32_t uVar2;
  uint uVar3;
  result_type rVar4;
  
  this_00 = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .rnd;
  rVar4 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  if ((rVar4 & 1) != 0) {
    puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
    *puVar1 = *puVar1 & 0xf;
    rVar4 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this_00);
    if ((rVar4 & 1) != 0) {
      rVar4 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()(this_00);
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
      *puVar1 = *puVar1 ^ 1 << ((byte)rVar4 & 0x1f);
    }
  }
  if (0xf < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
            chipset.card_type) {
    puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
  }
  if (0x10 < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .chipset.chipset) {
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
    uVar3 = uVar2 - 0x94;
    if (((uVar3 < 0xc) && ((0x837U >> (uVar3 & 0x1f) & 1) != 0)) ||
       ((uVar3 = uVar2 - 0x54, uVar3 < 0xc && ((0x807U >> (uVar3 & 0x1f) & 1) != 0)))) {
      puVar1 = &(this->super_SingleMthdTest).super_MthdTest.val;
      *(byte *)puVar1 = (byte)*puVar1 & 0xfb;
    }
  }
  return;
}

Assistant:

void MthdNop::adjust_orig_mthd() {
	if (rnd() & 1) {
		val &= 0xf;
		if (rnd() & 1)
			val ^= 1 << (rnd() & 0x1f);
	}
	// XXX: this triggers DMA
	if (chipset.card_type >= 0x10)
		val &= ~2;
	// XXX: figure this out
	if (nv04_pgraph_is_nv15p(&chipset) &&
		(cls == 0x5f || cls == 0x9f || cls == 0x54 || cls == 0x94 || cls == 0x55 || cls == 0x95 ||
		 cls == 0x56 || cls == 0x96 || cls == 0x98 || cls == 0x99))
		val &= ~4;
}